

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O3

int get_tx_type_cost(MACROBLOCK *x,MACROBLOCKD *xd,int plane,TX_SIZE tx_size,TX_TYPE tx_type,
                    int reduced_tx_set_used)

{
  uint uVar1;
  MB_MODE_INFO *pMVar2;
  int iVar3;
  int *piVar4;
  PREDICTION_MODE *pPVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  
  iVar3 = 0;
  if (0 < plane) {
    return 0;
  }
  uVar10 = (ulong)tx_size;
  pMVar2 = *xd->mi;
  uVar9 = 1;
  if (-1 < (char)*(ushort *)&pMVar2->field_0xa7) {
    uVar9 = (ulong)('\0' < pMVar2->ref_frame[0]);
  }
  if ((0x61810UL >> (uVar10 & 0x3f) & 1) != 0) {
    return 0;
  }
  iVar8 = (int)uVar9;
  bVar7 = (byte)uVar9;
  bVar6 = bVar7;
  if ((0x18608UL >> (uVar10 & 0x3f) & 1) == 0) {
    if (reduced_tx_set_used != 0) goto LAB_0024a6a3;
    bVar6 = av1_ext_tx_set_lookup[0]
            [(ulong)((0x60604UL >> (uVar10 & 0x3f) & 1) != 0) + (ulong)(uint)(iVar8 * 2)];
  }
  if (bVar6 == 0) {
    return 0;
  }
LAB_0024a6a3:
  if (xd->lossless[*(ushort *)&pMVar2->field_0xa7 & 7] == 0) {
    if ((0x18608UL >> (uVar10 & 0x3f) & 1) == 0) {
      if (reduced_tx_set_used == 0) {
        bVar7 = av1_ext_tx_set_lookup[0]
                [(ulong)((0x60604UL >> (uVar10 & 0x3f) & 1) != 0) + (ulong)(uint)(iVar8 * 2)];
      }
      else {
        bVar7 = (iVar8 == 0) + 1;
      }
    }
    uVar1 = ext_tx_set_index[uVar9][bVar7];
    if (iVar8 == 0) {
      if ((int)uVar1 < 1) {
        return 0;
      }
      if ((pMVar2->filter_intra_mode_info).use_filter_intra == '\0') {
        pPVar5 = &pMVar2->mode;
      }
      else {
        pPVar5 = "" + (pMVar2->filter_intra_mode_info).filter_intra_mode;
      }
      piVar4 = (x->mode_costs).intra_tx_type_costs[uVar1][""[uVar10]][*pPVar5] + tx_type;
    }
    else {
      if ((int)uVar1 < 1) {
        return 0;
      }
      piVar4 = (x->mode_costs).inter_tx_type_costs[uVar1][""[uVar10]] + tx_type;
    }
    iVar3 = *piVar4;
  }
  return iVar3;
}

Assistant:

static int get_tx_type_cost(const MACROBLOCK *x, const MACROBLOCKD *xd,
                            int plane, TX_SIZE tx_size, TX_TYPE tx_type,
                            int reduced_tx_set_used) {
  if (plane > 0) return 0;

  const TX_SIZE square_tx_size = txsize_sqr_map[tx_size];

  const MB_MODE_INFO *mbmi = xd->mi[0];
  const int is_inter = is_inter_block(mbmi);
  if (get_ext_tx_types(tx_size, is_inter, reduced_tx_set_used) > 1 &&
      !xd->lossless[xd->mi[0]->segment_id]) {
    const int ext_tx_set =
        get_ext_tx_set(tx_size, is_inter, reduced_tx_set_used);
    if (is_inter) {
      if (ext_tx_set > 0)
        return x->mode_costs
            .inter_tx_type_costs[ext_tx_set][square_tx_size][tx_type];
    } else {
      if (ext_tx_set > 0) {
        PREDICTION_MODE intra_dir;
        if (mbmi->filter_intra_mode_info.use_filter_intra)
          intra_dir = fimode_to_intradir[mbmi->filter_intra_mode_info
                                             .filter_intra_mode];
        else
          intra_dir = mbmi->mode;
        return x->mode_costs.intra_tx_type_costs[ext_tx_set][square_tx_size]
                                                [intra_dir][tx_type];
      }
    }
  }
  return 0;
}